

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int decode_client_hello(ptls_t *tls,st_ptls_client_hello_t *ch,uint8_t *src,uint8_t *end,
                       ptls_handshake_properties_t *properties)

{
  byte bVar1;
  code *pcVar2;
  undefined8 uVar3;
  size_t sVar4;
  uint8_t *puVar5;
  ptls_context_t *ppVar6;
  long lVar7;
  uint16_t uVar8;
  long *plVar9;
  int iVar10;
  uint uVar11;
  uint8_t **ppuVar12;
  uint8_t **in_RCX;
  long in_RDX;
  uint8_t **ppuVar13;
  byte *p;
  uint8_t **p_00;
  ptls_t *in_RSI;
  long *in_RDI;
  long in_R8;
  ptls_iovec_t pVar14;
  uint8_t *end_21;
  uint8_t *_src_20;
  uint64_t _block_size64_20;
  size_t _block_size_20;
  size_t _capacity_20;
  uint8_t *end_20;
  uint8_t *_src_19;
  uint64_t _block_size64_19;
  size_t _block_size_19;
  size_t _capacity_19;
  size_t num_binders;
  uint8_t *end_19;
  uint8_t *_src_18;
  uint64_t _block_size64_18;
  size_t _block_size_18;
  size_t _capacity_18;
  uint8_t *end_18;
  uint8_t *_src_17;
  uint64_t _block_size64_17;
  size_t _block_size_17;
  size_t _capacity_17;
  st_ptls_client_hello_psk_t psk;
  uint8_t *end_17;
  uint8_t *_src_16;
  uint64_t _block_size64_16;
  size_t _block_size_16;
  size_t _capacity_16;
  size_t num_identities;
  uint8_t *end_16;
  uint8_t *_src_15;
  uint64_t _block_size64_15;
  size_t _block_size_15;
  size_t _capacity_15;
  uint8_t *end_15;
  uint8_t *_src_14;
  uint64_t _block_size64_14;
  size_t _block_size_14;
  size_t _capacity_14;
  uint8_t *end_14;
  uint8_t *_src_13;
  uint64_t _block_size64_13;
  size_t _block_size_13;
  size_t _capacity_13;
  uint8_t *end_13;
  uint8_t *_src_12;
  uint64_t _block_size64_12;
  size_t _block_size_12;
  size_t _capacity_12;
  uint16_t v;
  size_t i;
  size_t selected_index;
  uint8_t *end_12;
  uint8_t *_src_11;
  uint64_t _block_size64_11;
  size_t _block_size_11;
  size_t _capacity_11;
  uint16_t id_1;
  uint8_t *end_11;
  uint8_t *_src_10;
  uint64_t _block_size64_10;
  size_t _block_size_10;
  size_t _capacity_10;
  size_t list_size;
  uint8_t *end_10;
  uint8_t *_src_9;
  uint64_t _block_size64_9;
  size_t _block_size_9;
  size_t _capacity_9;
  uint8_t *end_9;
  uint8_t *_src_8;
  uint64_t _block_size64_8;
  size_t _block_size_8;
  size_t _capacity_8;
  uint8_t *end_8;
  uint8_t *_src_7;
  uint64_t _block_size64_7;
  size_t _block_size_7;
  size_t _capacity_7;
  size_t len_1;
  uint8_t *end_7;
  uint8_t *_src_6;
  uint64_t _block_size64_6;
  size_t _block_size_6;
  size_t _capacity_6;
  size_t len;
  uint8_t *end_6;
  uint8_t *_src_5;
  uint64_t _block_size64_5;
  size_t _block_size_5;
  size_t _capacity_5;
  uint16_t csid;
  ptls_cipher_suite_t **cipher;
  uint8_t *end_5;
  uint8_t *_src_4;
  uint64_t _block_size64_4;
  size_t _block_size_4;
  size_t _capacity_4;
  uint8_t *end_4;
  uint8_t *_src_3;
  uint64_t _block_size64_3;
  size_t _block_size_3;
  size_t _capacity_3;
  st_ptls_extension_bitmap_t bitmap;
  uint8_t *end_3;
  uint8_t *_src_2;
  uint64_t _block_size64_2;
  size_t _block_size_2;
  size_t _capacity_2;
  uint16_t *id;
  uint8_t *end_2;
  uint8_t *_src_1;
  uint64_t _block_size64_1;
  size_t _block_size_1;
  size_t _capacity_1;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  int ret;
  uint16_t exttype;
  ptls_handshake_properties_t *in_stack_fffffffffffffab8;
  ptls_t *in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac8;
  uint in_stack_fffffffffffffacc;
  ptls_t *in_stack_fffffffffffffad8;
  ptls_t *in_stack_fffffffffffffae0;
  ptls_t *in_stack_fffffffffffffae8;
  uint8_t *in_stack_fffffffffffffaf0;
  ptls_t *in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffb00;
  ptls_t *ppVar15;
  ptls_t *bitmap_00;
  uint8_t **in_stack_fffffffffffffb38;
  ptls_iovec_t *in_stack_fffffffffffffb40;
  ulong local_4b0;
  long local_4a8;
  uint8_t *local_4a0;
  size_t *local_498;
  ulong local_478;
  long local_470;
  ulong local_468;
  ulong local_448;
  long local_440;
  uint8_t *local_438;
  size_t local_430;
  ulong local_410;
  long local_408;
  uint8_t *local_400;
  size_t local_3f8;
  uint8_t **local_3d8;
  ulong local_3c0;
  long local_3b8;
  ulong local_3b0;
  ptls_iovec_t local_3a8;
  uint8_t **local_398;
  ulong local_380;
  long local_378;
  ptls_iovec_t local_370;
  uint8_t **local_360;
  ulong local_348;
  long local_340;
  uint8_t **local_338;
  ulong local_320;
  long local_318;
  uint8_t **local_310;
  ulong local_2f8;
  long local_2f0;
  ptls_iovec_t local_2e8;
  uint16_t local_2d2;
  long local_2d0;
  long local_2c8;
  uint8_t **local_2c0;
  ulong local_2a8;
  long local_2a0;
  ptls_iovec_t local_298;
  ptls_iovec_t local_288;
  undefined2 local_272;
  uint8_t **local_270;
  ulong local_258;
  long local_250;
  long local_248;
  uint8_t **local_240;
  ulong local_228;
  long local_220;
  ptls_iovec_t local_218;
  uint8_t **local_208;
  ulong local_1f0;
  long local_1e8;
  uint8_t **local_1e0;
  ulong local_1c8;
  long local_1c0;
  ptls_iovec_t local_1b8;
  ulong local_1a8;
  uint8_t **local_1a0;
  ulong local_188;
  long local_180;
  long local_178;
  byte *local_170;
  ulong local_158;
  long local_150;
  short local_142;
  long *local_140;
  ptls_iovec_t local_138;
  uint8_t **local_128;
  ulong local_110;
  long local_108;
  uint8_t **local_100;
  ulong local_e8;
  long local_e0;
  st_ptls_extension_bitmap_t local_d8;
  uint8_t **local_d0;
  ulong local_b8;
  long local_b0;
  en_ptls_state_t *local_a8;
  ptls_iovec_t local_a0;
  uint8_t **local_90;
  ulong local_78;
  long local_70;
  ptls_iovec_t local_68;
  uint8_t **local_58;
  ulong local_40;
  long local_38;
  uint local_30;
  uint16_t local_2a;
  long local_28;
  uint8_t **local_20;
  uint8_t **local_18;
  ptls_t *local_10;
  long *local_8;
  
  local_2a = 0;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = (uint8_t **)in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_30 = ptls_decode16((uint16_t *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8)
                           ,(uint8_t **)in_stack_fffffffffffffac0,
                           (uint8_t *)in_stack_fffffffffffffab8);
  if (local_30 == 0) {
    if (*(ushort *)&local_10->ctx < 0x301) {
      local_30 = 0x46;
    }
    else if ((long)local_20 - (long)local_18 < 0x20) {
      local_30 = 0x32;
    }
    else {
      *(uint8_t ***)&local_10->state = local_18;
      local_38 = 1;
      if (local_20 == (uint8_t **)((long)local_18 + 0x20)) {
        local_30 = 0x32;
      }
      else {
        local_40 = 0;
        local_18 = (uint8_t **)((long)local_18 + 0x20);
        do {
          ppuVar13 = (uint8_t **)((long)local_18 + 1);
          local_40 = local_40 << 8 | (ulong)*(byte *)local_18;
          local_38 = local_38 + -1;
          local_18 = ppuVar13;
        } while (local_38 != 0);
        if ((ulong)((long)local_20 - (long)ppuVar13) < local_40) {
          local_30 = 0x32;
        }
        else {
          local_58 = (uint8_t **)((long)ppuVar13 + local_40);
          if ((long)local_58 - (long)ppuVar13 < 0x21) {
            bitmap_00 = local_10;
            local_68 = ptls_iovec_init(ppuVar13,(long)local_58 - (long)ppuVar13);
            (bitmap_00->recvbuf).rec.base = local_68.base;
            (bitmap_00->recvbuf).rec.capacity = local_68.len;
            local_18 = local_58;
            local_70 = 2;
            if ((ulong)((long)local_20 - (long)local_58) < 2) {
              local_30 = 0x32;
            }
            else {
              local_78 = 0;
              do {
                ppuVar13 = (uint8_t **)((long)local_18 + 1);
                local_78 = local_78 << 8 | (ulong)*(byte *)local_18;
                local_70 = local_70 + -1;
                local_18 = ppuVar13;
              } while (local_70 != 0);
              if ((ulong)((long)local_20 - (long)ppuVar13) < local_78) {
                local_30 = 0x32;
              }
              else {
                local_90 = (uint8_t **)((long)ppuVar13 + local_78);
                ppVar15 = local_10;
                local_a0 = ptls_iovec_init(ppuVar13,(long)local_90 - (long)ppuVar13);
                (ppVar15->recvbuf).mess.capacity = (size_t)local_a0.base;
                (ppVar15->recvbuf).mess.off = local_a0.len;
                local_a8 = &local_10[1].state;
                uVar11 = local_30;
                do {
                  local_30 = uVar11;
                  local_30 = ptls_decode16((uint16_t *)
                                           CONCAT44(in_stack_fffffffffffffacc,
                                                    in_stack_fffffffffffffac8),
                                           (uint8_t **)in_stack_fffffffffffffac0,
                                           (uint8_t *)in_stack_fffffffffffffab8);
                  if (local_30 != 0) {
                    return local_30;
                  }
                  local_a8 = (en_ptls_state_t *)((long)local_a8 + 2);
                  *(long *)&local_10[1].recvbuf.mess.is_allocated =
                       *(long *)&local_10[1].recvbuf.mess.is_allocated + 1;
                  if (&local_10[1].recvbuf.mess.is_allocated <= local_a8) {
                    local_18 = local_90;
                    break;
                  }
                  uVar11 = 0;
                } while (local_18 != local_90);
                if (local_18 == local_90) {
                  local_b0 = 1;
                  if (local_20 == local_18) {
                    local_30 = 0x32;
                  }
                  else {
                    local_b8 = 0;
                    do {
                      ppuVar13 = (uint8_t **)((long)local_18 + 1);
                      local_b8 = local_b8 << 8 | (ulong)*(byte *)local_18;
                      local_b0 = local_b0 + -1;
                      local_18 = ppuVar13;
                    } while (local_b0 != 0);
                    if ((ulong)((long)local_20 - (long)ppuVar13) < local_b8) {
                      local_30 = 0x32;
                    }
                    else {
                      local_d0 = (uint8_t **)((long)ppuVar13 + local_b8);
                      if (ppuVar13 == local_d0) {
                        local_30 = 0x32;
                      }
                      else {
                        (local_10->recvbuf).rec.off = (size_t)ppuVar13;
                        *(long *)&(local_10->recvbuf).rec.is_allocated =
                             (long)local_d0 - (long)ppuVar13;
                        local_18 = local_d0;
                        init_extension_bitmap
                                  ((st_ptls_extension_bitmap_t *)bitmap_00,
                                   (uint8_t)((ulong)ppVar15 >> 0x38));
                        local_e0 = 2;
                        if ((ulong)((long)local_20 - (long)local_18) < 2) {
                          local_30 = 0x32;
                        }
                        else {
                          local_e8 = 0;
                          do {
                            local_100 = (uint8_t **)((long)local_18 + 1);
                            local_e8 = local_e8 << 8 | (ulong)*(byte *)local_18;
                            local_e0 = local_e0 + -1;
                            local_18 = local_100;
                          } while (local_e0 != 0);
                          if ((ulong)((long)local_20 - (long)local_100) < local_e8) {
                            local_30 = 0x32;
                          }
                          else {
                            local_100 = (uint8_t **)((long)local_100 + local_e8);
                            local_e0 = 0;
                            while (local_18 != local_100) {
                              local_30 = ptls_decode16((uint16_t *)
                                                       CONCAT44(in_stack_fffffffffffffacc,
                                                                in_stack_fffffffffffffac8),
                                                       (uint8_t **)in_stack_fffffffffffffac0,
                                                       (uint8_t *)in_stack_fffffffffffffab8);
                              if (local_30 != 0) {
                                return local_30;
                              }
                              iVar10 = extension_bitmap_is_set(&local_d8,local_2a);
                              if (iVar10 != 0) {
                                return 0x2f;
                              }
                              extension_bitmap_set(&local_d8,local_2a);
                              plVar9 = local_8;
                              uVar8 = local_2a;
                              local_108 = 2;
                              if ((ulong)((long)local_100 - (long)local_18) < 2) {
                                return 0x32;
                              }
                              local_110 = 0;
                              do {
                                ppuVar13 = (uint8_t **)((long)local_18 + 1);
                                local_110 = local_110 << 8 | (ulong)*(byte *)local_18;
                                local_108 = local_108 + -1;
                                local_18 = ppuVar13;
                              } while (local_108 != 0);
                              if ((ulong)((long)local_100 - (long)ppuVar13) < local_110) {
                                return 0x32;
                              }
                              local_128 = (uint8_t **)((long)ppuVar13 + local_110);
                              *(byte *)((long)&local_10[1].esni + 4) =
                                   *(byte *)((long)&local_10[1].esni + 4) & 0xfd;
                              if (*(long *)(*local_8 + 0xb0) != 0) {
                                pcVar2 = (code *)**(undefined8 **)(*local_8 + 0xb0);
                                uVar3 = *(undefined8 *)(*local_8 + 0xb0);
                                local_138 = ptls_iovec_init(ppuVar13,(long)local_128 -
                                                                     (long)ppuVar13);
                                iVar10 = (*pcVar2)(uVar3,plVar9,1,uVar8,local_138.base,local_138.len
                                                  );
                                local_30 = (uint)(iVar10 != 0);
                                if (iVar10 != 0) {
                                  return local_30;
                                }
                              }
                              uVar11 = (uint)local_2a;
                              if (uVar11 == 0) {
                                iVar10 = client_hello_decode_server_name
                                                   (in_stack_fffffffffffffb40,
                                                    in_stack_fffffffffffffb38,(uint8_t *)bitmap_00);
                                if (iVar10 != 0) {
                                  return iVar10;
                                }
                                if (local_18 != local_128) {
                                  return 0x32;
                                }
                                local_30 = 0;
                              }
                              else if (uVar11 == 5) {
                                *(byte *)&local_10[2].traffic_protection.enc.aead =
                                     *(byte *)&local_10[2].traffic_protection.enc.aead & 0xfe | 1;
                              }
                              else if (uVar11 == 10) {
                                in_stack_fffffffffffffae8 = local_10;
                                local_288 = ptls_iovec_init(local_18,(long)local_128 -
                                                                     (long)local_18);
                                *(uint8_t **)&(in_stack_fffffffffffffae8->recvbuf).mess.is_allocated
                                     = local_288.base;
                                in_stack_fffffffffffffae8->key_schedule =
                                     (ptls_key_schedule_t *)local_288.len;
                              }
                              else if (uVar11 == 0xd) {
                                iVar10 = decode_signature_algorithms
                                                   ((st_ptls_signature_algorithms_t *)
                                                    (ulong)CONCAT24(local_2a,
                                                  in_stack_fffffffffffffb00),
                                                  (uint8_t **)in_stack_fffffffffffffaf8,
                                                  in_stack_fffffffffffffaf0);
                                if (iVar10 != 0) {
                                  return iVar10;
                                }
                                local_30 = 0;
                              }
                              else if (uVar11 == 0x10) {
                                local_1c0 = 2;
                                if ((ulong)((long)local_128 - (long)local_18) < 2) {
                                  return 0x32;
                                }
                                local_1c8 = 0;
                                do {
                                  local_1e0 = (uint8_t **)((long)local_18 + 1);
                                  local_1c8 = local_1c8 << 8 | (ulong)*(byte *)local_18;
                                  local_1c0 = local_1c0 + -1;
                                  local_18 = local_1e0;
                                } while (local_1c0 != 0);
                                if ((ulong)((long)local_128 - (long)local_1e0) < local_1c8) {
                                  return 0x32;
                                }
                                local_1e0 = (uint8_t **)((long)local_1e0 + local_1c8);
                                local_1c0 = 0;
                                do {
                                  local_1e8 = 1;
                                  if (local_1e0 == local_18) {
                                    return 0x32;
                                  }
                                  local_1f0 = 0;
                                  do {
                                    ppuVar13 = (uint8_t **)((long)local_18 + 1);
                                    local_1f0 = local_1f0 << 8 | (ulong)*(byte *)local_18;
                                    local_1e8 = local_1e8 + -1;
                                    local_18 = ppuVar13;
                                  } while (local_1e8 != 0);
                                  if ((ulong)((long)local_1e0 - (long)ppuVar13) < local_1f0) {
                                    return 0x32;
                                  }
                                  local_208 = (uint8_t **)((long)ppuVar13 + local_1f0);
                                  if (ppuVar13 == local_208) {
                                    return 0x32;
                                  }
                                  if ((local_10->field_18).client.certificate_request.
                                      signature_algorithms.count < 0x10) {
                                    sVar4 = (local_10->field_18).client.certificate_request.
                                            signature_algorithms.count;
                                    (local_10->field_18).client.certificate_request.
                                    signature_algorithms.count = sVar4 + 1;
                                    in_stack_fffffffffffffaf0 =
                                         local_10->client_random + sVar4 * 0x10 + -0x50;
                                    local_218 = ptls_iovec_init(ppuVar13,(long)local_208 -
                                                                         (long)ppuVar13);
                                    *(uint8_t **)in_stack_fffffffffffffaf0 = local_218.base;
                                    *(size_t *)(in_stack_fffffffffffffaf0 + 8) = local_218.len;
                                  }
                                  local_18 = local_208;
                                } while (local_208 != local_1e0);
                                if (local_208 != local_1e0) {
                                  return 0x32;
                                }
                                if (local_208 != local_128) {
                                  return 0x32;
                                }
                              }
                              else if (uVar11 == 0x14) {
                                local_220 = 1;
                                if (local_128 == local_18) {
                                  return 0x32;
                                }
                                local_228 = 0;
                                do {
                                  ppuVar13 = (uint8_t **)((long)local_18 + 1);
                                  local_228 = local_228 << 8 | (ulong)*(byte *)local_18;
                                  local_220 = local_220 + -1;
                                  local_18 = ppuVar13;
                                } while (local_220 != 0);
                                if ((ulong)((long)local_128 - (long)ppuVar13) < local_228) {
                                  return 0x32;
                                }
                                local_240 = (uint8_t **)((long)ppuVar13 + local_228);
                                local_248 = (long)local_240 - (long)ppuVar13;
                                if ((local_248 == 0) ||
                                   ((local_248 == 1 && (*(byte *)ppuVar13 == 0)))) {
                                  return 0x32;
                                }
                                do {
                                  if (local_10[1].exporter_master_secret.one_rtt < (uint8_t *)0x8) {
                                    bVar1 = *(byte *)local_18;
                                    puVar5 = local_10[1].exporter_master_secret.one_rtt;
                                    local_10[1].exporter_master_secret.one_rtt = puVar5 + 1;
                                    puVar5[(long)&local_10[1].exporter_master_secret.early] = bVar1;
                                  }
                                  local_18 = (uint8_t **)((long)local_18 + 1);
                                } while (local_18 != local_240);
                                if (local_18 != local_240) {
                                  return 0x32;
                                }
                                if (local_18 != local_128) {
                                  return 0x32;
                                }
                                local_220 = 0;
                              }
                              else if (uVar11 == 0x1b) {
                                local_250 = 1;
                                if (local_128 == local_18) {
                                  return 0x32;
                                }
                                local_258 = 0;
                                do {
                                  local_270 = (uint8_t **)((long)local_18 + 1);
                                  local_258 = local_258 << 8 | (ulong)*(byte *)local_18;
                                  local_250 = local_250 + -1;
                                  local_18 = local_270;
                                } while (local_250 != 0);
                                if ((ulong)((long)local_128 - (long)local_270) < local_258) {
                                  return 0x32;
                                }
                                local_270 = (uint8_t **)((long)local_270 + local_258);
                                local_250 = 0;
                                do {
                                  iVar10 = ptls_decode16((uint16_t *)
                                                         CONCAT44(in_stack_fffffffffffffacc,
                                                                  in_stack_fffffffffffffac8),
                                                         (uint8_t **)in_stack_fffffffffffffac0,
                                                         (uint8_t *)in_stack_fffffffffffffab8);
                                  if (iVar10 != 0) {
                                    return iVar10;
                                  }
                                  if (local_10[1].ctx < (ptls_context_t *)0x10) {
                                    ppVar6 = local_10[1].ctx;
                                    local_10[1].ctx =
                                         (ptls_context_t *)((long)&ppVar6->random_bytes + 1);
                                    *(undefined2 *)
                                     ((long)&(local_10->certificate_verify).cb + (long)ppVar6 * 2) =
                                         local_272;
                                  }
                                  local_30 = 0;
                                } while (local_18 != local_270);
                                if (local_18 != local_270) {
                                  return 0x32;
                                }
                                if (local_18 != local_128) {
                                  return 0x32;
                                }
                                local_30 = 0;
                              }
                              else if (uVar11 == 0x29) {
                                local_3b8 = 2;
                                if ((ulong)((long)local_128 - (long)local_18) < 2) {
                                  return 0x32;
                                }
                                local_3c0 = 0;
                                do {
                                  local_3d8 = (uint8_t **)((long)local_18 + 1);
                                  local_3c0 = local_3c0 << 8 | (ulong)*(byte *)local_18;
                                  local_3b8 = local_3b8 + -1;
                                  local_18 = local_3d8;
                                } while (local_3b8 != 0);
                                local_3b0 = 0;
                                if ((ulong)((long)local_128 - (long)local_3d8) < local_3c0) {
                                  return 0x32;
                                }
                                local_3d8 = (uint8_t **)((long)local_3d8 + local_3c0);
                                local_3b8 = 0;
                                do {
                                  memset(&local_400,0,0x28);
                                  local_408 = 2;
                                  if ((ulong)((long)local_3d8 - (long)local_18) < 2) {
                                    return 0x32;
                                  }
                                  local_410 = 0;
                                  do {
                                    ppuVar13 = (uint8_t **)((long)local_18 + 1);
                                    local_410 = local_410 << 8 | (ulong)*(byte *)local_18;
                                    local_408 = local_408 + -1;
                                    local_18 = ppuVar13;
                                  } while (local_408 != 0);
                                  if ((ulong)((long)local_3d8 - (long)ppuVar13) < local_410) {
                                    return 0x32;
                                  }
                                  pVar14 = ptls_iovec_init(ppuVar13,(long)((long)ppuVar13 +
                                                                          local_410) -
                                                                    (long)ppuVar13);
                                  local_438 = pVar14.base;
                                  local_400 = local_438;
                                  local_430 = pVar14.len;
                                  local_3f8 = local_430;
                                  local_18 = (uint8_t **)((long)ppuVar13 + local_410);
                                  local_30 = ptls_decode32((uint32_t *)
                                                           CONCAT44(in_stack_fffffffffffffacc,
                                                                    in_stack_fffffffffffffac8),
                                                           (uint8_t **)in_stack_fffffffffffffac0,
                                                           (uint8_t *)in_stack_fffffffffffffab8);
                                  if (local_30 != 0) {
                                    return local_30;
                                  }
                                  if (*(ulong *)(local_10[1].client_random + 0x18) < 4) {
                                    lVar7 = *(long *)(local_10[1].client_random + 0x18);
                                    *(long *)(local_10[1].client_random + 0x18) = lVar7 + 1;
                                    memcpy(local_10[1].traffic_protection.enc.secret +
                                           lVar7 * 0x28 + -0x10,&local_400,0x28);
                                  }
                                  local_3b0 = local_3b0 + 1;
                                } while (local_18 != local_3d8);
                                if (local_18 != local_3d8) {
                                  return 0x32;
                                }
                                local_10[1].traffic_protection.dec.epoch = (size_t)local_18;
                                local_440 = 2;
                                if ((ulong)((long)local_128 - (long)local_18) < 2) {
                                  return 0x32;
                                }
                                local_448 = 0;
                                do {
                                  ppuVar13 = (uint8_t **)((long)local_18 + 1);
                                  local_448 = local_448 << 8 | (ulong)*(byte *)local_18;
                                  local_440 = local_440 + -1;
                                  local_18 = ppuVar13;
                                } while (local_440 != 0);
                                if ((ulong)((long)local_128 - (long)ppuVar13) < local_448) {
                                  return 0x32;
                                }
                                ppuVar13 = (uint8_t **)((long)ppuVar13 + local_448);
                                local_468 = 0;
                                do {
                                  local_470 = 1;
                                  if (ppuVar13 == local_18) {
                                    return 0x32;
                                  }
                                  local_478 = 0;
                                  do {
                                    p_00 = (uint8_t **)((long)local_18 + 1);
                                    local_478 = local_478 << 8 | (ulong)*(byte *)local_18;
                                    local_470 = local_470 + -1;
                                    local_18 = p_00;
                                  } while (local_470 != 0);
                                  if ((ulong)((long)ppuVar13 - (long)p_00) < local_478) {
                                    return 0x32;
                                  }
                                  ppuVar12 = (uint8_t **)((long)p_00 + local_478);
                                  if (local_468 < *(ulong *)(local_10[1].client_random + 0x18)) {
                                    in_stack_fffffffffffffab8 =
                                         (ptls_handshake_properties_t *)
                                         (local_10[1].traffic_protection.enc.secret +
                                         local_468 * 0x28 + -0x10);
                                    pVar14 = ptls_iovec_init(p_00,(long)ppuVar12 - (long)p_00);
                                    local_4a0 = pVar14.base;
                                    (in_stack_fffffffffffffab8->field_0).client.session_ticket.len =
                                         (size_t)local_4a0;
                                    local_498 = (size_t *)pVar14.len;
                                    (in_stack_fffffffffffffab8->field_0).client.max_early_data_size
                                         = local_498;
                                  }
                                  local_468 = local_468 + 1;
                                  local_18 = ppuVar12;
                                } while (ppuVar12 != ppuVar13);
                                if (local_3b0 != local_468) {
                                  return 0x2f;
                                }
                                if (ppuVar12 != ppuVar13) {
                                  return 0x32;
                                }
                                if (ppuVar12 != local_128) {
                                  return 0x32;
                                }
                                *(byte *)((long)&local_10[1].esni + 4) =
                                     *(byte *)((long)&local_10[1].esni + 4) & 0xfd | 2;
                              }
                              else if (uVar11 == 0x2a) {
                                *(byte *)((long)&local_10[1].esni + 4) =
                                     *(byte *)((long)&local_10[1].esni + 4) & 0xfe | 1;
                              }
                              else if (uVar11 == 0x2b) {
                                local_2a0 = 1;
                                if (local_128 == local_18) {
                                  return 0x32;
                                }
                                local_2a8 = 0;
                                do {
                                  local_2c0 = (uint8_t **)((long)local_18 + 1);
                                  local_2a8 = local_2a8 << 8 | (ulong)*(byte *)local_18;
                                  local_2a0 = local_2a0 + -1;
                                  local_18 = local_2c0;
                                } while (local_2a0 != 0);
                                if ((ulong)((long)local_128 - (long)local_2c0) < local_2a8) {
                                  return 0x32;
                                }
                                local_2c0 = (uint8_t **)((long)local_2c0 + local_2a8);
                                local_2c8 = 4;
                                local_2a0 = 0;
                                do {
                                  iVar10 = ptls_decode16((uint16_t *)
                                                         CONCAT44(in_stack_fffffffffffffacc,
                                                                  in_stack_fffffffffffffac8),
                                                         (uint8_t **)in_stack_fffffffffffffac0,
                                                         (uint8_t *)in_stack_fffffffffffffab8);
                                  if (iVar10 != 0) {
                                    return iVar10;
                                  }
                                  for (local_2d0 = 0; local_2d0 != local_2c8;
                                      local_2d0 = local_2d0 + 1) {
                                    if (supported_versions[local_2d0] == local_2d2) {
                                      local_2c8 = local_2d0;
                                      break;
                                    }
                                  }
                                  local_30 = 0;
                                } while (local_18 != local_2c0);
                                if (local_2c8 != 4) {
                                  *(uint16_t *)&(local_10->recvbuf).mess.base =
                                       supported_versions[local_2c8];
                                }
                                if (local_18 != local_2c0) {
                                  return 0x32;
                                }
                                if (local_18 != local_128) {
                                  return 0x32;
                                }
                                local_30 = 0;
                              }
                              else if (uVar11 == 0x2c) {
                                if ((local_28 == 0) || (*(long *)(local_28 + 0x48) == 0)) {
                                  return 0x2f;
                                }
                                in_stack_fffffffffffffad8 = local_10;
                                local_2e8 = ptls_iovec_init(local_18,(long)local_128 -
                                                                     (long)local_18);
                                ppVar15 = local_10;
                                in_stack_fffffffffffffad8[1].key_schedule =
                                     (ptls_key_schedule_t *)local_2e8.base;
                                *(size_t *)
                                 in_stack_fffffffffffffad8[1].traffic_protection.dec.secret =
                                     local_2e8.len;
                                local_2f0 = 2;
                                if ((ulong)((long)local_128 - (long)local_18) < 2) {
                                  return 0x32;
                                }
                                local_2f8 = 0;
                                do {
                                  ppuVar13 = (uint8_t **)((long)local_18 + 1);
                                  local_2f8 = local_2f8 << 8 | (ulong)*(byte *)local_18;
                                  local_2f0 = local_2f0 + -1;
                                  local_18 = ppuVar13;
                                } while (local_2f0 != 0);
                                if ((ulong)((long)local_128 - (long)ppuVar13) < local_2f8) {
                                  return 0x32;
                                }
                                local_310 = (uint8_t **)((long)ppuVar13 + local_2f8);
                                *(uint8_t ***)(local_10[1].traffic_protection.dec.secret + 8) =
                                     ppuVar13;
                                local_318 = 2;
                                if ((ulong)((long)local_310 - (long)ppuVar13) < 2) {
                                  return 0x32;
                                }
                                local_320 = 0;
                                do {
                                  ppuVar13 = (uint8_t **)((long)local_18 + 1);
                                  local_320 = local_320 << 8 | (ulong)*(byte *)local_18;
                                  local_318 = local_318 + -1;
                                  local_18 = ppuVar13;
                                } while (local_318 != 0);
                                if ((ulong)((long)local_310 - (long)ppuVar13) < local_320) {
                                  return 0x32;
                                }
                                local_338 = (uint8_t **)((long)ppuVar13 + local_320);
                                local_340 = 1;
                                if (local_338 == ppuVar13) {
                                  return 0x32;
                                }
                                local_348 = 0;
                                do {
                                  ppuVar13 = (uint8_t **)((long)local_18 + 1);
                                  local_348 = local_348 << 8 | (ulong)*(byte *)local_18;
                                  local_340 = local_340 + -1;
                                  local_18 = ppuVar13;
                                } while (local_340 != 0);
                                local_340 = 0;
                                if ((ulong)((long)local_338 - (long)ppuVar13) < local_348) {
                                  return 0x32;
                                }
                                local_360 = (uint8_t **)((long)ppuVar13 + local_348);
                                local_370 = ptls_iovec_init(ppuVar13,(long)local_360 -
                                                                     (long)ppuVar13);
                                *(uint8_t **)(ppVar15[1].traffic_protection.dec.secret + 0x18) =
                                     local_370.base;
                                *(size_t *)(ppVar15[1].traffic_protection.dec.secret + 0x20) =
                                     local_370.len;
                                if (local_360 == local_338) {
                                  return 0x32;
                                }
                                local_18 = (uint8_t **)((long)local_360 + 1);
                                in_stack_fffffffffffffacc = (uint)*(byte *)local_360;
                                if (in_stack_fffffffffffffacc == 0) {
                                  if ((local_10[1].traffic_protection.dec.secret[0x38] & 1) != 0) {
                                    __assert_fail("!ch->cookie.sent_key_share",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                                                  ,0xd47,
                                                  "int decode_client_hello(ptls_t *, struct st_ptls_client_hello_t *, const uint8_t *, const uint8_t *const, ptls_handshake_properties_t *)"
                                                 );
                                  }
                                }
                                else {
                                  if (in_stack_fffffffffffffacc != 1) {
                                    return 0x32;
                                  }
                                  local_10[1].traffic_protection.dec.secret[0x38] =
                                       local_10[1].traffic_protection.dec.secret[0x38] & 0xfe | 1;
                                }
                                if (local_18 != local_338) {
                                  return 0x32;
                                }
                                *(long *)(local_10[1].traffic_protection.dec.secret + 0x10) =
                                     (long)local_18 -
                                     *(long *)(local_10[1].traffic_protection.dec.secret + 8);
                                local_378 = 1;
                                if (local_310 == local_18) {
                                  return 0x32;
                                }
                                local_380 = 0;
                                do {
                                  ppuVar13 = (uint8_t **)((long)local_18 + 1);
                                  local_380 = local_380 << 8 | (ulong)*(byte *)local_18;
                                  local_378 = local_378 + -1;
                                  local_18 = ppuVar13;
                                } while (local_378 != 0);
                                local_378 = 0;
                                if ((ulong)((long)local_310 - (long)ppuVar13) < local_380) {
                                  return 0x32;
                                }
                                local_398 = (uint8_t **)((long)ppuVar13 + local_380);
                                in_stack_fffffffffffffac0 = local_10;
                                local_3a8 = ptls_iovec_init(ppuVar13,(long)local_398 -
                                                                     (long)ppuVar13);
                                *(uint8_t **)
                                 (in_stack_fffffffffffffac0[1].traffic_protection.dec.secret + 0x28)
                                     = local_3a8.base;
                                *(size_t *)
                                 (in_stack_fffffffffffffac0[1].traffic_protection.dec.secret + 0x30)
                                     = local_3a8.len;
                                if (local_398 != local_310) {
                                  return 0x32;
                                }
                                if (local_398 != local_310) {
                                  return 0x32;
                                }
                                if (local_398 != local_128) {
                                  return 0x32;
                                }
                              }
                              else if (uVar11 == 0x2d) {
                                local_4a8 = 1;
                                if (local_128 == local_18) {
                                  return 0x32;
                                }
                                local_4b0 = 0;
                                do {
                                  ppuVar13 = (uint8_t **)((long)local_18 + 1);
                                  local_4b0 = local_4b0 << 8 | (ulong)*(byte *)local_18;
                                  local_4a8 = local_4a8 + -1;
                                  local_18 = ppuVar13;
                                } while (local_4a8 != 0);
                                if ((ulong)((long)local_128 - (long)ppuVar13) < local_4b0) {
                                  return 0x32;
                                }
                                in_stack_fffffffffffffb38 = (uint8_t **)((long)ppuVar13 + local_4b0)
                                ;
                                if (ppuVar13 == in_stack_fffffffffffffb38) {
                                  return 0x32;
                                }
                                for (; local_18 != in_stack_fffffffffffffb38;
                                    local_18 = (uint8_t **)((long)local_18 + 1)) {
                                  if (*(byte *)local_18 < 0x20) {
                                    *(uint *)&local_10[1].esni =
                                         1 << (*(byte *)local_18 & 0x1f) |
                                         *(uint *)&local_10[1].esni;
                                  }
                                }
                                if (local_18 != in_stack_fffffffffffffb38) {
                                  return 0x32;
                                }
                                if (local_18 != local_128) {
                                  return 0x32;
                                }
                              }
                              else if (uVar11 == 0x33) {
                                in_stack_fffffffffffffae0 = local_10;
                                local_298 = ptls_iovec_init(local_18,(long)local_128 -
                                                                     (long)local_18);
                                *(uint8_t **)
                                 (in_stack_fffffffffffffae0->traffic_protection).dec.secret =
                                     local_298.base;
                                *(size_t *)
                                 ((in_stack_fffffffffffffae0->traffic_protection).dec.secret + 8) =
                                     local_298.len;
                              }
                              else if (uVar11 == 0xffce) {
                                if ((local_10->traffic_protection).dec.aead !=
                                    (ptls_aead_context_t *)0x0) {
                                  return 0x2f;
                                }
                                local_30 = ptls_decode16((uint16_t *)
                                                         CONCAT44(in_stack_fffffffffffffacc,
                                                                  in_stack_fffffffffffffac8),
                                                         (uint8_t **)in_stack_fffffffffffffac0,
                                                         (uint8_t *)in_stack_fffffffffffffab8);
                                if (local_30 != 0) {
                                  return local_30;
                                }
                                for (local_140 = *(long **)(*local_8 + 0x18);
                                    (*local_140 != 0 && (*(short *)*local_140 != local_142));
                                    local_140 = local_140 + 1) {
                                }
                                if (*local_140 == 0) {
                                  return 0x2f;
                                }
                                local_30 = select_key_share((ptls_key_exchange_algorithm_t **)
                                                            CONCAT44(uVar11,
                                                  in_stack_fffffffffffffb00),
                                                  (ptls_iovec_t *)in_stack_fffffffffffffaf8,
                                                  (ptls_key_exchange_algorithm_t **)
                                                  in_stack_fffffffffffffaf0,
                                                  (uint8_t **)in_stack_fffffffffffffae8,
                                                  (uint8_t *)in_stack_fffffffffffffae0,
                                                  (int)((ulong)in_stack_fffffffffffffad8 >> 0x20));
                                if (local_30 != 0) {
                                  return local_30;
                                }
                                local_150 = 2;
                                if ((ulong)((long)local_128 - (long)local_18) < 2) {
                                  return 0x32;
                                }
                                local_158 = 0;
                                do {
                                  ppuVar13 = (uint8_t **)((long)local_18 + 1);
                                  local_158 = local_158 << 8 | (ulong)*(byte *)local_18;
                                  local_150 = local_150 + -1;
                                  local_18 = ppuVar13;
                                } while (local_150 != 0);
                                if ((ulong)((long)local_128 - (long)ppuVar13) < local_158) {
                                  return 0x32;
                                }
                                local_170 = (byte *)((long)ppuVar13 + local_158);
                                local_178 = (long)local_170 - (long)ppuVar13;
                                if (local_178 != *(long *)(*(long *)(*local_140 + 0x10) + 8)) {
                                  return 0x2f;
                                }
                                *(uint8_t ***)((local_10->traffic_protection).enc.secret + 0x10) =
                                     ppuVar13;
                                local_18 = (uint8_t **)(local_178 + (long)ppuVar13);
                                if (local_18 != (uint8_t **)local_170) {
                                  return 0x32;
                                }
                                local_180 = 2;
                                if ((ulong)((long)local_128 - (long)local_18) < 2) {
                                  return 0x32;
                                }
                                local_188 = 0;
                                do {
                                  p = (byte *)((long)local_18 + 1);
                                  local_188 = local_188 << 8 | (ulong)*(byte *)local_18;
                                  local_180 = local_180 + -1;
                                  local_18 = (uint8_t **)p;
                                } while (local_180 != 0);
                                if ((ulong)((long)local_128 - (long)p) < local_188) {
                                  return 0x32;
                                }
                                local_1a0 = (uint8_t **)(p + local_188);
                                local_1a8 = (long)local_1a0 - (long)p;
                                if (local_1a8 < *(ulong *)(*(long *)(*local_140 + 8) + 0x38)) {
                                  return 0x2f;
                                }
                                in_stack_fffffffffffffaf8 = local_10;
                                local_1b8 = ptls_iovec_init(p,local_1a8);
                                *(uint8_t **)
                                 ((in_stack_fffffffffffffaf8->traffic_protection).enc.secret + 0x18)
                                     = local_1b8.base;
                                *(size_t *)
                                 ((in_stack_fffffffffffffaf8->traffic_protection).enc.secret + 0x20)
                                     = local_1b8.len;
                                if ((uint8_t **)((long)local_18 + local_1a8) != local_1a0) {
                                  return 0x32;
                                }
                                if ((uint8_t **)((long)local_18 + local_1a8) != local_128) {
                                  return 0x32;
                                }
                                (local_10->traffic_protection).dec.aead =
                                     (ptls_aead_context_t *)*local_140;
                              }
                              else {
                                iVar10 = should_collect_unknown_extension
                                                   (in_stack_fffffffffffffac0,
                                                    in_stack_fffffffffffffab8,0);
                                if (iVar10 != 0) {
                                  iVar10 = collect_unknown_extension
                                                     (in_stack_fffffffffffffaf8,
                                                      (uint16_t)
                                                      ((ulong)in_stack_fffffffffffffaf0 >> 0x30),
                                                      (uint8_t *)in_stack_fffffffffffffae8,
                                                      (uint8_t *)in_stack_fffffffffffffae0,
                                                      (ptls_raw_extension_t *)
                                                      in_stack_fffffffffffffad8);
                                  if (iVar10 != 0) {
                                    return iVar10;
                                  }
                                  local_30 = 0;
                                }
                              }
                              local_18 = local_128;
                            }
                            if (local_18 == local_100) {
                              if (local_18 == local_20) {
                                local_30 = 0;
                              }
                              else {
                                local_30 = 0x32;
                              }
                            }
                            else {
                              local_30 = 0x32;
                            }
                          }
                        }
                      }
                    }
                  }
                }
                else {
                  local_30 = 0x32;
                }
              }
            }
          }
          else {
            local_30 = 0x32;
          }
        }
      }
    }
  }
  return local_30;
}

Assistant:

static int decode_client_hello(ptls_t *tls, struct st_ptls_client_hello_t *ch, const uint8_t *src, const uint8_t *const end,
                               ptls_handshake_properties_t *properties)
{
    uint16_t exttype = 0;
    int ret;

    /* decode protocol version (do not bare to decode something older than TLS 1.0) */
    if ((ret = ptls_decode16(&ch->legacy_version, &src, end)) != 0)
        goto Exit;
    if (ch->legacy_version < 0x0301) {
        ret = PTLS_ALERT_PROTOCOL_VERSION;
        goto Exit;
    }

    /* skip random */
    if (end - src < PTLS_HELLO_RANDOM_SIZE) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }
    ch->random_bytes = src;
    src += PTLS_HELLO_RANDOM_SIZE;

    /* skip legacy_session_id */
    ptls_decode_open_block(src, end, 1, {
        if (end - src > 32) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        ch->legacy_session_id = ptls_iovec_init(src, end - src);
        src = end;
    });

    /* decode and select from ciphersuites */
    ptls_decode_open_block(src, end, 2, {
        ch->cipher_suites = ptls_iovec_init(src, end - src);
        uint16_t *id = ch->client_ciphers.list;
        do {
            if ((ret = ptls_decode16(id, &src, end)) != 0)
                goto Exit;
            id++;
            ch->client_ciphers.count++;
            if (id >= ch->client_ciphers.list + MAX_CLIENT_CIPHERS) {
                src = end;
                break;
            }
        } while (src != end);
    });

    /* decode legacy_compression_methods */
    ptls_decode_open_block(src, end, 1, {
        if (src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        ch->compression_methods.ids = src;
        ch->compression_methods.count = end - src;
        src = end;
    });

    /* decode extensions */
    decode_extensions(src, end, PTLS_HANDSHAKE_TYPE_CLIENT_HELLO, &exttype, {
        ch->psk.is_last_extension = 0;
        if (tls->ctx->on_extension != NULL &&
            (ret = tls->ctx->on_extension->cb(tls->ctx->on_extension, tls, PTLS_HANDSHAKE_TYPE_CLIENT_HELLO, exttype,
                                              ptls_iovec_init(src, end - src)) != 0))
            goto Exit;
        switch (exttype) {
        case PTLS_EXTENSION_TYPE_SERVER_NAME:
            if ((ret = client_hello_decode_server_name(&ch->server_name, &src, end)) != 0)
                goto Exit;
            if (src != end) {
                ret = PTLS_ALERT_DECODE_ERROR;
                goto Exit;
            }
            break;
        case PTLS_EXTENSION_TYPE_ENCRYPTED_SERVER_NAME: {
            ptls_cipher_suite_t **cipher;
            if (ch->esni.cipher != NULL) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
            { /* cipher-suite */
                uint16_t csid;
                if ((ret = ptls_decode16(&csid, &src, end)) != 0)
                    goto Exit;
                for (cipher = tls->ctx->cipher_suites; *cipher != NULL; ++cipher)
                    if ((*cipher)->id == csid)
                        break;
                if (*cipher == NULL) {
                    ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                    goto Exit;
                }
            }
            /* key-share (including peer-key) */
            if ((ret = select_key_share(&ch->esni.key_share, &ch->esni.peer_key, tls->ctx->key_exchanges, &src, end, 1)) != 0)
                goto Exit;
            ptls_decode_open_block(src, end, 2, {
                size_t len = end - src;
                if (len != (*cipher)->hash->digest_size) {
                    ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                    goto Exit;
                }
                ch->esni.record_digest = src;
                src += len;
            });
            ptls_decode_block(src, end, 2, {
                size_t len = end - src;
                if (len < (*cipher)->aead->tag_size) {
                    ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                    goto Exit;
                }
                ch->esni.encrypted_sni = ptls_iovec_init(src, len);
                src += len;
            });
            ch->esni.cipher = *cipher; /* set only after successful parsing */
        } break;
        case PTLS_EXTENSION_TYPE_ALPN:
            ptls_decode_block(src, end, 2, {
                do {
                    ptls_decode_open_block(src, end, 1, {
                        /* rfc7301 3.1: empty strings MUST NOT be included */
                        if (src == end) {
                            ret = PTLS_ALERT_DECODE_ERROR;
                            goto Exit;
                        }
                        if (ch->alpn.count < PTLS_ELEMENTSOF(ch->alpn.list))
                            ch->alpn.list[ch->alpn.count++] = ptls_iovec_init(src, end - src);
                        src = end;
                    });
                } while (src != end);
            });
            break;
        case PTLS_EXTENSION_TYPE_SERVER_CERTIFICATE_TYPE:
            ptls_decode_block(src, end, 1, {
                size_t list_size = end - src;

                /* RFC7250 4.1: No empty list, no list with single x509 element */
                if (list_size == 0 || (list_size == 1 && *src == PTLS_CERTIFICATE_TYPE_X509)) {
                    ret = PTLS_ALERT_DECODE_ERROR;
                    goto Exit;
                }

                do {
                    if (ch->server_certificate_types.count < PTLS_ELEMENTSOF(ch->server_certificate_types.list))
                        ch->server_certificate_types.list[ch->server_certificate_types.count++] = *src;
                    src++;
                } while (src != end);
            });
            break;
        case PTLS_EXTENSION_TYPE_COMPRESS_CERTIFICATE:
            ptls_decode_block(src, end, 1, {
                do {
                    uint16_t id;
                    if ((ret = ptls_decode16(&id, &src, end)) != 0)
                        goto Exit;
                    if (ch->cert_compression_algos.count < PTLS_ELEMENTSOF(ch->cert_compression_algos.list))
                        ch->cert_compression_algos.list[ch->cert_compression_algos.count++] = id;
                } while (src != end);
            });
            break;
        case PTLS_EXTENSION_TYPE_SUPPORTED_GROUPS:
            ch->negotiated_groups = ptls_iovec_init(src, end - src);
            break;
        case PTLS_EXTENSION_TYPE_SIGNATURE_ALGORITHMS:
            if ((ret = decode_signature_algorithms(&ch->signature_algorithms, &src, end)) != 0)
                goto Exit;
            break;
        case PTLS_EXTENSION_TYPE_KEY_SHARE:
            ch->key_shares = ptls_iovec_init(src, end - src);
            break;
        case PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS:
            ptls_decode_block(src, end, 1, {
                size_t selected_index = PTLS_ELEMENTSOF(supported_versions);
                do {
                    size_t i;
                    uint16_t v;
                    if ((ret = ptls_decode16(&v, &src, end)) != 0)
                        goto Exit;
                    for (i = 0; i != selected_index; ++i) {
                        if (supported_versions[i] == v) {
                            selected_index = i;
                            break;
                        }
                    }
                } while (src != end);
                if (selected_index != PTLS_ELEMENTSOF(supported_versions))
                    ch->selected_version = supported_versions[selected_index];
            });
            break;
        case PTLS_EXTENSION_TYPE_COOKIE:
            if (properties == NULL || properties->server.cookie.key == NULL) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
            ch->cookie.all = ptls_iovec_init(src, end - src);
            ptls_decode_block(src, end, 2, {
                ch->cookie.tbs.base = (void *)src;
                ptls_decode_open_block(src, end, 2, {
                    ptls_decode_open_block(src, end, 1, {
                        ch->cookie.ch1_hash = ptls_iovec_init(src, end - src);
                        src = end;
                    });
                    if (src == end) {
                        ret = PTLS_ALERT_DECODE_ERROR;
                        goto Exit;
                    }
                    switch (*src++) {
                    case 0:
                        assert(!ch->cookie.sent_key_share);
                        break;
                    case 1:
                        ch->cookie.sent_key_share = 1;
                        break;
                    default:
                        ret = PTLS_ALERT_DECODE_ERROR;
                        goto Exit;
                    }
                });
                ch->cookie.tbs.len = src - ch->cookie.tbs.base;
                ptls_decode_block(src, end, 1, {
                    ch->cookie.signature = ptls_iovec_init(src, end - src);
                    src = end;
                });
            });
            break;
        case PTLS_EXTENSION_TYPE_PRE_SHARED_KEY: {
            size_t num_identities = 0;
            ptls_decode_open_block(src, end, 2, {
                do {
                    struct st_ptls_client_hello_psk_t psk = {{NULL}};
                    ptls_decode_open_block(src, end, 2, {
                        psk.identity = ptls_iovec_init(src, end - src);
                        src = end;
                    });
                    if ((ret = ptls_decode32(&psk.obfuscated_ticket_age, &src, end)) != 0)
                        goto Exit;
                    if (ch->psk.identities.count < PTLS_ELEMENTSOF(ch->psk.identities.list))
                        ch->psk.identities.list[ch->psk.identities.count++] = psk;
                    ++num_identities;
                } while (src != end);
            });
            ch->psk.hash_end = src;
            ptls_decode_block(src, end, 2, {
                size_t num_binders = 0;
                do {
                    ptls_decode_open_block(src, end, 1, {
                        if (num_binders < ch->psk.identities.count)
                            ch->psk.identities.list[num_binders].binder = ptls_iovec_init(src, end - src);
                        src = end;
                    });
                    ++num_binders;
                } while (src != end);
                if (num_identities != num_binders) {
                    ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                    goto Exit;
                }
            });
            ch->psk.is_last_extension = 1;
        } break;
        case PTLS_EXTENSION_TYPE_PSK_KEY_EXCHANGE_MODES:
            ptls_decode_block(src, end, 1, {
                if (src == end) {
                    ret = PTLS_ALERT_DECODE_ERROR;
                    goto Exit;
                }
                for (; src != end; ++src) {
                    if (*src < sizeof(ch->psk.ke_modes) * 8)
                        ch->psk.ke_modes |= 1u << *src;
                }
            });
            break;
        case PTLS_EXTENSION_TYPE_EARLY_DATA:
            ch->psk.early_data_indication = 1;
            break;
        case PTLS_EXTENSION_TYPE_STATUS_REQUEST:
            ch->status_request = 1;
            break;
        default:
            if (should_collect_unknown_extension(tls, properties, exttype)) {
                if ((ret = collect_unknown_extension(tls, exttype, src, end, ch->unknown_extensions)) != 0)
                    goto Exit;
            }
            break;
        }
        src = end;
    });

    ret = 0;
Exit:
    return ret;
}